

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_xor(void)

{
  byte bVar1;
  byte bVar2;
  undefined4 *puVar3;
  byte bVar4;
  ushort pram;
  byte bVar5;
  uint uVar6;
  
  uVar6 = registe_ptr->IP;
  bVar4 = code_ptr[uVar6 + 2];
  bVar1 = bVar4 >> 4;
  bVar5 = bVar4 & 0xf;
  if (code_ptr[uVar6 + 1] == '\x01') {
    if (bVar5 == 2) {
      uVar6 = *register_list[bVar1] ^ *(uint *)(code_ptr + (ulong)uVar6 + 3);
      *register_list[bVar1] = uVar6;
LAB_00103e23:
      set_flag(uVar6);
      return 1;
    }
    if (bVar5 == 1) {
      pram = (ushort)*register_list[bVar1] ^ *(ushort *)(code_ptr + (ulong)uVar6 + 3);
      *(ushort *)register_list[bVar1] = pram;
LAB_00103de9:
      set_flag(pram);
      return 1;
    }
    if ((bVar4 & 0xf) == 0) {
      bVar4 = (byte)*register_list[bVar1] ^ code_ptr[(ulong)uVar6 + 3];
      *(byte *)register_list[bVar1] = bVar4;
LAB_00103da3:
      set_flag(bVar4);
      return 1;
    }
  }
  else if (code_ptr[uVar6 + 1] == '\0') {
    bVar2 = (byte)code_ptr[uVar6 + 3] >> 4;
    if (bVar5 == 2) {
      uVar6 = *register_list[bVar1] ^ *register_list[bVar2];
      *register_list[bVar1] = uVar6;
      goto LAB_00103e23;
    }
    if (bVar5 == 1) {
      pram = (ushort)*register_list[bVar1] ^ (ushort)*register_list[bVar2];
      *(ushort *)register_list[bVar1] = pram;
      goto LAB_00103de9;
    }
    if ((bVar4 & 0xf) == 0) {
      bVar4 = (byte)*register_list[bVar1] ^ (byte)*register_list[bVar2];
      *(byte *)register_list[bVar1] = bVar4;
      goto LAB_00103da3;
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0xf6;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

int do_xor() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}